

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
llvm::cl::basic_parser_impl::printOptionInfo(basic_parser_impl *this,Option *O,size_t GlobalWidth)

{
  Option *this_00;
  char *pcVar1;
  StringRef DefaultMsg;
  int iVar2;
  uint uVar3;
  raw_ostream *prVar4;
  undefined4 extraout_var;
  size_t Indent;
  size_t extraout_RDX;
  size_t in_R8;
  StringRef SVar5;
  StringRef HelpStr;
  StringRef ValName;
  size_t GlobalWidth_local;
  Option *O_local;
  basic_parser_impl *this_local;
  
  prVar4 = outs();
  prVar4 = raw_ostream::operator<<(prVar4,"  -");
  raw_ostream::operator<<(prVar4,O->ArgStr);
  iVar2 = (**this->_vptr_basic_parser_impl)();
  if (extraout_RDX != 0) {
    uVar3 = Option::getMiscFlags(O);
    if ((uVar3 & 2) == 0) {
      prVar4 = outs();
      prVar4 = raw_ostream::operator<<(prVar4,"=<");
      SVar5.Length = extraout_RDX;
      SVar5.Data = (char *)CONCAT44(extraout_var,iVar2);
      SVar5 = getValueStr(O,SVar5);
      prVar4 = raw_ostream::operator<<(prVar4,SVar5);
      raw_ostream::operator<<(prVar4,'>');
    }
    else {
      prVar4 = outs();
      prVar4 = raw_ostream::operator<<(prVar4," <");
      DefaultMsg.Length = extraout_RDX;
      DefaultMsg.Data = (char *)CONCAT44(extraout_var,iVar2);
      SVar5 = getValueStr(O,DefaultMsg);
      prVar4 = raw_ostream::operator<<(prVar4,SVar5);
      raw_ostream::operator<<(prVar4,">...");
    }
  }
  this_00 = (Option *)(O->HelpStr).Data;
  pcVar1 = (char *)(O->HelpStr).Length;
  Indent = getOptionWidth(this,O);
  HelpStr.Length = GlobalWidth;
  HelpStr.Data = pcVar1;
  Option::printHelpStr(this_00,HelpStr,Indent,in_R8);
  return;
}

Assistant:

void basic_parser_impl::printOptionInfo(const Option &O,
                                        size_t GlobalWidth) const {
  outs() << "  -" << O.ArgStr;

  auto ValName = getValueName();
  if (!ValName.empty()) {
    if (O.getMiscFlags() & PositionalEatsArgs) {
      outs() << " <" << getValueStr(O, ValName) << ">...";
    } else {
      outs() << "=<" << getValueStr(O, ValName) << '>';
    }
  }

  Option::printHelpStr(O.HelpStr, GlobalWidth, getOptionWidth(O));
}